

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O1

string * __thiscall
BCLog::Logger::GetLogPrefix_abi_cxx11_
          (string *__return_storage_ptr__,Logger *this,LogFlags category,Level level)

{
  _Hash_node_base *p_Var1;
  Level extraout_EDX;
  Level extraout_EDX_00;
  Level extraout_EDX_01;
  Level extraout_EDX_02;
  Level level_00;
  __node_base_ptr p_Var2;
  __node_base_ptr p_Var3;
  byte bVar4;
  _Hash_node_base *p_Var5;
  long in_FS_OFFSET;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  p_Var5 = (_Hash_node_base *)(-(ulong)(category == NONE) | category);
  bVar4 = p_Var5 != (_Hash_node_base *)0xffffffffffffffff | this->m_always_print_category_level;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (level == Info && bVar4 == 0) {
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"[","");
    level_00 = extraout_EDX;
    if (bVar4 != 0) {
      if (p_Var5 == (_Hash_node_base *)0xffffffffffffffff) {
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        local_58.field_2._M_allocated_capacity._0_4_ = 0x6c6c61;
        local_58._M_string_length = 3;
      }
      else {
        p_Var2 = LOG_CATEGORIES_BY_FLAG_abi_cxx11_._M_h._M_buckets
                 [(ulong)p_Var5 % LOG_CATEGORIES_BY_FLAG_abi_cxx11_._M_h._M_bucket_count];
        p_Var3 = (__node_base_ptr)0x0;
        if ((p_Var2 != (__node_base_ptr)0x0) &&
           (p_Var1 = p_Var2->_M_nxt, p_Var3 = p_Var2, p_Var2->_M_nxt[1]._M_nxt != p_Var5)) {
          while (p_Var2 = p_Var1, p_Var1 = p_Var2->_M_nxt, p_Var1 != (_Hash_node_base *)0x0) {
            p_Var3 = (__node_base_ptr)0x0;
            if (((ulong)p_Var1[1]._M_nxt % LOG_CATEGORIES_BY_FLAG_abi_cxx11_._M_h._M_bucket_count !=
                 (ulong)p_Var5 % LOG_CATEGORIES_BY_FLAG_abi_cxx11_._M_h._M_bucket_count) ||
               (p_Var3 = p_Var2, p_Var1[1]._M_nxt == p_Var5)) goto LAB_0016cac1;
          }
          p_Var3 = (__node_base_ptr)0x0;
        }
LAB_0016cac1:
        if (p_Var3 == (__node_base_ptr)0x0) {
          p_Var5 = (_Hash_node_base *)0x0;
        }
        else {
          p_Var5 = p_Var3->_M_nxt;
        }
        if (p_Var5 == (_Hash_node_base *)0x0) {
          __assert_fail("it != LOG_CATEGORIES_BY_FLAG.end()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/logging.cpp"
                        ,0xfc,"std::string LogCategoryToStr(BCLog::LogFlags)");
        }
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_58,p_Var5[2]._M_nxt,
                   (long)&(p_Var5[2]._M_nxt)->_M_nxt + (long)&(p_Var5[3]._M_nxt)->_M_nxt);
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (__return_storage_ptr__,local_58._M_dataplus._M_p,local_58._M_string_length);
      level_00 = extraout_EDX_00;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,
                        CONCAT44(local_58.field_2._M_allocated_capacity._4_4_,
                                 local_58.field_2._M_allocated_capacity._0_4_) + 1);
        level_00 = extraout_EDX_01;
      }
    }
    if ((bVar4 & level == Debug & (this->m_always_print_category_level ^ 1U)) == 0) {
      if (bVar4 != 0) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (__return_storage_ptr__,":");
        level_00 = extraout_EDX_02;
      }
      LogLevelToStr_abi_cxx11_(&local_58,(Logger *)(ulong)level,level_00);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (__return_storage_ptr__,local_58._M_dataplus._M_p,local_58._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,
                        CONCAT44(local_58.field_2._M_allocated_capacity._4_4_,
                                 local_58.field_2._M_allocated_capacity._0_4_) + 1);
      }
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__,"] ");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

std::string BCLog::Logger::GetLogPrefix(BCLog::LogFlags category, BCLog::Level level) const
{
    if (category == LogFlags::NONE) category = LogFlags::ALL;

    const bool has_category{m_always_print_category_level || category != LogFlags::ALL};

    // If there is no category, Info is implied
    if (!has_category && level == Level::Info) return {};

    std::string s{"["};
    if (has_category) {
        s += LogCategoryToStr(category);
    }

    if (m_always_print_category_level || !has_category || level != Level::Debug) {
        // If there is a category, Debug is implied, so don't add the level

        // Only add separator if we have a category
        if (has_category) s += ":";
        s += Logger::LogLevelToStr(level);
    }

    s += "] ";
    return s;
}